

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O0

bool template_image::_AssignmentOperator<signed_char>(void)

{
  bool bVar1;
  uint32_t uVar2;
  ImageTemplate<signed_char> image_copy;
  ImageTemplate<signed_char> image;
  uint8_t alignment;
  uint8_t colorCount;
  uint32_t height;
  uint32_t width;
  uint32_t i;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined2 uVar3;
  uint8_t minimum;
  uint8_t colorCount_;
  ImageTemplate<signed_char> *image2;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff84;
  int iVar5;
  char in_stack_ffffffffffffff8f;
  ImageTemplate<signed_char> *in_stack_ffffffffffffff90;
  ImageTemplate<signed_char> local_40;
  uchar local_12;
  uchar local_11;
  uint local_10;
  uint local_c;
  uint local_8;
  byte local_1;
  
  local_8 = 0;
  while (uVar4 = local_8, uVar2 = Test_Helper::runCount(), uVar4 < uVar2) {
    uVar2 = 0x400;
    local_c = Test_Helper::randomValue<unsigned_int>(0x19349e);
    local_10 = Test_Helper::randomValue<unsigned_int>(0x1934ae);
    uVar3 = 1;
    minimum = '\0';
    colorCount_ = '\0';
    local_11 = Test_Helper::randomValue<unsigned_char>('\0',uVar2);
    local_12 = Test_Helper::randomValue<unsigned_char>(minimum,uVar2);
    image2 = &local_40;
    PenguinV_Image::ImageTemplate<signed_char>::ImageTemplate
              ((ImageTemplate<signed_char> *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
               (uint32_t)((ulong)image2 >> 0x20),(uint32_t)image2,colorCount_,minimum);
    Test_Helper::randomValue<unsigned_char>(0x19351c);
    PenguinV_Image::ImageTemplate<signed_char>::fill
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    PenguinV_Image::ImageTemplate<signed_char>::ImageTemplate
              ((ImageTemplate<signed_char> *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
               (uint32_t)((ulong)image2 >> 0x20),(uint32_t)image2,colorCount_,minimum);
    PenguinV_Image::ImageTemplate<signed_char>::operator=
              ((ImageTemplate<signed_char> *)
               CONCAT17(colorCount_,CONCAT16(minimum,CONCAT24(uVar3,uVar2))),
               (ImageTemplate<signed_char> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<signed_char>>
                      ((ImageTemplate<signed_char> *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
                       image2);
    if ((bVar1) &&
       (in_stack_ffffffffffffff6f =
             Unit_Test::equalData<signed_char>
                       ((ImageTemplate<signed_char> *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
                        image2), (bool)in_stack_ffffffffffffff6f)) {
      iVar5 = 0;
    }
    else {
      local_1 = 0;
      iVar5 = 1;
    }
    PenguinV_Image::ImageTemplate<signed_char>::~ImageTemplate
              ((ImageTemplate<signed_char> *)0x1935d7);
    PenguinV_Image::ImageTemplate<signed_char>::~ImageTemplate
              ((ImageTemplate<signed_char> *)0x1935e1);
    if (iVar5 != 0) goto LAB_00193619;
    local_8 = local_8 + 1;
    in_stack_ffffffffffffff84 = 0;
  }
  local_1 = 1;
LAB_00193619:
  return (bool)(local_1 & 1);
}

Assistant:

bool _AssignmentOperator()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            PenguinV_Image::ImageTemplate < _Type > image( width, height, colorCount, alignment );
            image.fill( static_cast<_Type>( Unit_Test::randomValue<uint8_t>( 256u ) ) );

            PenguinV_Image::ImageTemplate < _Type > image_copy;

            image_copy = image;

            if( !Unit_Test::equalSize( image, image_copy ) || !Unit_Test::equalData( image, image_copy ) )
                return false;
        }

        return true;
    }